

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# properties.cpp
# Opt level: O3

bool wasm::Properties::isValidConstantExpression(Module *wasm,Expression *expr)

{
  undefined1 uVar1;
  Expression **ppEVar2;
  undefined1 auStack_108 [8];
  Walker walker;
  Expression *local_20;
  Expression *expr_local;
  
  auStack_108 = (undefined1  [8])0x0;
  walker.super_PostWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.
  super_Walker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.replacep = (Expression **)0x0;
  walker.super_PostWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.
  super_Walker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.stack.fixed._M_elems[9].currp
       = (Expression **)0x0;
  walker.super_PostWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.
  super_Walker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.stack.flexible.
  super__Vector_base<wasm::Walker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>::Task,_std::allocator<wasm::Walker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>::Task>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  walker.super_PostWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.
  super_Walker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.stack.flexible.
  super__Vector_base<wasm::Walker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>::Task,_std::allocator<wasm::Walker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>::Task>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  walker.super_PostWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.
  super_Walker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.stack.flexible.
  super__Vector_base<wasm::Walker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>::Task,_std::allocator<wasm::Walker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>::Task>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  walker.super_PostWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.
  super_Walker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.currModule._0_1_ = 1;
  walker.super_PostWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.
  super_Walker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.currFunction =
       (Function *)wasm;
  local_20 = expr;
  Walker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>::pushTask
            ((Walker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_> *)auStack_108,
             PostWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>::scan,&local_20);
  if (((long)walker.super_PostWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.
             super_Walker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.stack.flexible.
             super__Vector_base<wasm::Walker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>::Task,_std::allocator<wasm::Walker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>::Task>_>
             ._M_impl.super__Vector_impl_data._M_start -
       (long)walker.super_PostWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.
             super_Walker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.stack.fixed.
             _M_elems[9].currp >> 4) +
      (long)walker.super_PostWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.
            super_Walker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.replacep != 0) {
    do {
      if ((pointer)walker.super_PostWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.
                   super_Walker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.stack.fixed.
                   _M_elems[9].currp ==
          walker.super_PostWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.
          super_Walker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.stack.flexible.
          super__Vector_base<wasm::Walker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>::Task,_std::allocator<wasm::Walker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>::Task>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        if (walker.super_PostWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.
            super_Walker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.replacep ==
            (Expression **)0x0) {
          __assert_fail("usedFixed > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/support/small_vector.h"
                        ,0x5a,
                        "T &wasm::SmallVector<wasm::Walker<Walker, wasm::UnifiedExpressionVisitor<Walker>>::Task, 10>::back() [T = wasm::Walker<Walker, wasm::UnifiedExpressionVisitor<Walker>>::Task, N = 10]"
                       );
        }
        ppEVar2 = walker.super_PostWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.
                  super_Walker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.stack.fixed.
                  _M_elems[(long)walker.
                                 super_PostWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>
                                 .
                                 super_Walker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>
                                 .replacep + -2].currp;
        auStack_108 = (undefined1  [8])
                      walker.super_PostWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>
                      .super_Walker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.stack.
                      fixed._M_elems
                      [(long)walker.
                             super_PostWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>
                             .super_Walker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.
                             replacep + -1].func;
        walker.super_PostWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.
        super_Walker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.replacep =
             (Expression **)
             ((long)walker.super_PostWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.
                    super_Walker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.replacep +
             -1);
      }
      else {
        ppEVar2 = (Expression **)
                  walker.super_PostWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.
                  super_Walker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.stack.flexible
                  .
                  super__Vector_base<wasm::Walker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>::Task,_std::allocator<wasm::Walker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>::Task>_>
                  ._M_impl.super__Vector_impl_data._M_start[-1].func;
        auStack_108 = (undefined1  [8])
                      walker.super_PostWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>
                      .super_Walker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.stack.
                      flexible.
                      super__Vector_base<wasm::Walker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>::Task,_std::allocator<wasm::Walker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>::Task>_>
                      ._M_impl.super__Vector_impl_data._M_start[-1].currp;
        walker.super_PostWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.
        super_Walker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.stack.flexible.
        super__Vector_base<wasm::Walker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>::Task,_std::allocator<wasm::Walker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>::Task>_>
        ._M_impl.super__Vector_impl_data._M_start =
             walker.super_PostWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.
             super_Walker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.stack.flexible.
             super__Vector_base<wasm::Walker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>::Task,_std::allocator<wasm::Walker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>::Task>_>
             ._M_impl.super__Vector_impl_data._M_start + -1;
      }
      if (*(Expression **)auStack_108 == (Expression *)0x0) {
        __assert_fail("*task.currp",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm-traversal.h"
                      ,0x139,
                      "void wasm::Walker<Walker, wasm::UnifiedExpressionVisitor<Walker>>::walk(Expression *&) [SubType = Walker, VisitorType = wasm::UnifiedExpressionVisitor<Walker>]"
                     );
      }
      (*(code *)ppEVar2)((Walker *)auStack_108,(Expression **)auStack_108);
    } while (((long)walker.super_PostWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.
                    super_Walker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.stack.
                    flexible.
                    super__Vector_base<wasm::Walker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>::Task,_std::allocator<wasm::Walker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>::Task>_>
                    ._M_impl.super__Vector_impl_data._M_start -
              (long)walker.super_PostWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.
                    super_Walker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.stack.fixed.
                    _M_elems[9].currp >> 4) +
             (long)walker.super_PostWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.
                   super_Walker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.replacep != 0
            );
  }
  uVar1 = walker.super_PostWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.
          super_Walker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.currModule._0_1_;
  if (walker.super_PostWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.
      super_Walker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.stack.fixed._M_elems[9].
      currp != (Expression **)0x0) {
    operator_delete(walker.super_PostWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.
                    super_Walker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.stack.fixed.
                    _M_elems[9].currp,
                    (long)walker.
                          super_PostWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.
                          super_Walker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.stack.
                          flexible.
                          super__Vector_base<wasm::Walker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>::Task,_std::allocator<wasm::Walker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>::Task>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)walker.
                          super_PostWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.
                          super_Walker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.stack.
                          fixed._M_elems[9].currp);
  }
  return (bool)uVar1;
}

Assistant:

bool isValidConstantExpression(Module& wasm, Expression* expr) {
  struct Walker : public PostWalker<Walker, UnifiedExpressionVisitor<Walker>> {
    bool valid = true;
    void visitExpression(Expression* curr) {
      if (!isValidInConstantExpression(*getModule(), curr)) {
        valid = false;
      }
    }
  } walker;
  walker.setModule(&wasm);
  walker.walk(expr);
  return walker.valid;
}